

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  HistogramPair *pHVar1;
  HistogramPair *pHVar2;
  ushort uVar3;
  VP8LHistogram **ppVVar4;
  VP8LHistogram *pVVar5;
  byte bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  HistogramPair *pHVar12;
  PixOrCopy *pPVar13;
  int tmp;
  int iVar14;
  uint uVar15;
  VP8LHistogramSet *set;
  ulong uVar16;
  VP8LHistogram *pVVar17;
  int64_t iVar18;
  uint32_t *puVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  size_t __n;
  VP8LHistogram **ppVVar27;
  short sVar28;
  uint16_t uVar29;
  uint uVar30;
  long lVar31;
  int64_t iVar32;
  short sVar33;
  uint32_t *puVar34;
  uint32_t *puVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  uint uVar46;
  long lVar47;
  ulong uVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  int iVar52;
  int iVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint64_t cost;
  uint64_t bit_cost;
  VP8LHistogram *local_200;
  ulong local_1f0;
  ulong local_1b0;
  HistoQueue local_1a8;
  uint64_t uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  uint32_t *local_178;
  VP8LHistogramSet *local_170;
  long local_168;
  uint32_t *local_160;
  uint32_t *local_158;
  uint32_t *local_150;
  uint32_t *local_148;
  uint64_t local_140;
  VP8LRefsCursor local_138;
  uint64_t uStack_120;
  uint64_t uStack_118;
  uint64_t uStack_110;
  uint64_t uStack_108;
  uint64_t uStack_100;
  
  bVar6 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    iVar24 = 1;
  }
  else {
    iVar24 = 1 << (bVar6 & 0x1f);
    iVar24 = ((ysize + iVar24) - 1U >> (bVar6 & 0x1f)) * ((iVar24 + xsize) - 1U >> (bVar6 & 0x1f));
  }
  set = VP8LAllocateHistogramSet(iVar24,cache_bits);
  lVar22 = 4;
  if (low_effort == 0) {
    lVar22 = 0x40;
  }
  local_170 = set;
  if (set != (VP8LHistogramSet *)0x0) {
    ppVVar27 = set->histograms;
    VP8LRefsCursorInit(&local_138,refs);
    VP8LHistogramSetClear(set);
    if (local_138.cur_pos != (PixOrCopy *)0x0) {
      iVar52 = 0;
      iVar49 = 0;
      do {
        pPVar13 = local_138.cur_pos;
        HistogramAddSinglePixOrCopy
                  (ppVVar27[(int)((iVar52 >> (bVar6 & 0x1f)) +
                                 (iVar49 >> (bVar6 & 0x1f)) *
                                 (((1 << (bVar6 & 0x1f)) + xsize) - 1U >> (bVar6 & 0x1f)))],
                   local_138.cur_pos,(_func_int_int_int *)0x0,0);
        for (iVar52 = (uint)pPVar13->len + iVar52; xsize <= iVar52; iVar52 = iVar52 - xsize) {
          iVar49 = iVar49 + 1;
        }
        local_138.cur_pos = local_138.cur_pos + 1;
        if (local_138.cur_pos == local_138.last_pos) {
          VP8LRefsCursorNextBlock(&local_138);
        }
      } while (local_138.cur_pos != (PixOrCopy *)0x0);
    }
    ppVVar27 = local_170->histograms;
    ppVVar4 = image_histo->histograms;
    image_histo->size = 0;
    if (local_170->max_size < 1) {
      uVar48 = 0;
    }
    else {
      local_200 = tmp_histo;
      lVar31 = 0;
      do {
        pVVar17 = ppVVar27[lVar31];
        ComputeHistogramCost(pVVar17);
        if ((((pVVar17->is_used[0] == '\0') && (pVVar17->is_used[1] == '\0')) &&
            (pVVar17->is_used[2] == '\0')) &&
           ((pVVar17->is_used[3] == '\0' && (pVVar17->is_used[4] == '\0')))) {
          ppVVar27[lVar31] = (VP8LHistogram *)0x0;
        }
        else {
          pVVar5 = ppVVar4[image_histo->size];
          iVar49 = pVVar5->palette_code_bits;
          iVar14 = (4 << ((byte)iVar49 & 0x1f)) + 0x1150;
          iVar52 = (1 << ((byte)iVar49 & 0x1f)) + 0x118;
          if (iVar49 < 1) {
            iVar52 = 0x118;
          }
          puVar35 = pVVar5->literal;
          if (iVar49 < 1) {
            iVar14 = 0x1150;
          }
          memcpy(pVVar5,pVVar17,(long)iVar14);
          pVVar5->literal = puVar35;
          memcpy(puVar35,pVVar17->literal,(long)iVar52 << 2);
          image_histo->size = image_histo->size + 1;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 < local_170->max_size);
      uVar46 = image_histo->size;
      uVar48 = (ulong)uVar46;
      uVar50 = (int)lVar22 * 2;
      if (quality < 100 &&
          (uVar46 != uVar50 && SBORROW4(uVar46,uVar50) == (int)(uVar46 + (int)lVar22 * -2) < 0)) {
        local_1b0 = 0x10;
        if (quality < 0x5a) {
          local_1b0 = (ulong)((((uint)(iVar24 < 0x101) * 8 + 8 >> (0x200 < iVar24)) >>
                              (0x400 < iVar24)) >> (quality < 0x33));
        }
        ppVVar27 = image_histo->histograms;
        if (0 < (int)uVar46) {
          uVar41 = 0;
          uVar16 = 0;
          uVar25 = 0;
          uVar51 = 0;
          uVar44 = 0xffffffffffffffff;
          uVar36 = 0xffffffffffffffff;
          uVar39 = 0xffffffffffffffff;
          do {
            pVVar17 = ppVVar27[uVar41];
            uVar23 = pVVar17->costs[0];
            uVar37 = pVVar17->costs[1];
            if (uVar16 <= uVar23) {
              uVar16 = uVar23;
            }
            if (uVar44 < uVar23) {
              uVar23 = uVar44;
            }
            if (uVar25 <= uVar37) {
              uVar25 = uVar37;
            }
            if (uVar36 < uVar37) {
              uVar37 = uVar36;
            }
            uVar40 = pVVar17->costs[2];
            if (uVar51 <= uVar40) {
              uVar51 = uVar40;
            }
            if (uVar39 < uVar40) {
              uVar40 = uVar39;
            }
            uVar41 = uVar41 + 1;
            uVar44 = uVar23;
            uVar36 = uVar37;
            uVar39 = uVar40;
          } while (uVar48 != uVar41);
          lVar31 = uVar16 - uVar23;
          auVar56._8_4_ = (int)((ulong)lVar31 >> 0x20);
          auVar56._0_8_ = lVar31;
          auVar56._12_4_ = 0x45300000;
          lVar42 = uVar25 - uVar37;
          auVar57._8_4_ = (int)((ulong)lVar42 >> 0x20);
          auVar57._0_8_ = lVar42;
          auVar57._12_4_ = 0x45300000;
          lVar43 = uVar51 - uVar40;
          auVar58._8_4_ = (int)((ulong)lVar43 >> 0x20);
          auVar58._0_8_ = lVar43;
          auVar58._12_4_ = 0x45300000;
          uVar44 = 0;
          do {
            pVVar17 = ppVVar27[uVar44];
            uVar29 = 0;
            if (uVar16 != uVar23) {
              lVar45 = pVVar17->costs[0] - uVar23;
              auVar59._8_4_ = (int)((ulong)lVar45 >> 0x20);
              auVar59._0_8_ = lVar45;
              auVar59._12_4_ = 0x45300000;
              uVar29 = (uint16_t)
                       (int)((((auVar59._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar45) - 4503599627370496.0)) *
                             3.999999) /
                            ((auVar56._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0)));
            }
            if (low_effort == 0) {
              sVar33 = 0;
              sVar28 = 0;
              if (uVar25 != uVar37) {
                lVar45 = pVVar17->costs[1] - uVar37;
                auVar60._8_4_ = (int)((ulong)lVar45 >> 0x20);
                auVar60._0_8_ = lVar45;
                auVar60._12_4_ = 0x45300000;
                sVar28 = (short)((int)((((auVar60._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)lVar45) -
                                        4503599627370496.0)) * 3.999999) /
                                      ((auVar57._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar42) - 4503599627370496.0
                                      ))) << 2);
              }
              if (uVar51 != uVar40) {
                lVar45 = pVVar17->costs[2] - uVar40;
                auVar61._8_4_ = (int)((ulong)lVar45 >> 0x20);
                auVar61._0_8_ = lVar45;
                auVar61._12_4_ = 0x45300000;
                sVar33 = (short)(int)((((auVar61._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar45) -
                                       4503599627370496.0)) * 3.999999) /
                                     ((auVar58._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar43) - 4503599627370496.0)
                                     ));
              }
              uVar29 = sVar28 + uVar29 * 0x10 + sVar33;
            }
            pVVar17->bin_id = uVar29;
            uVar44 = uVar44 + 1;
          } while (uVar48 != uVar44);
        }
        lVar31 = 0;
        do {
          *(undefined4 *)((long)&local_138.cur_pos + lVar31 * 4) = 0xffff;
          lVar31 = lVar31 + 1;
        } while (lVar22 != lVar31);
        if (0 < (int)uVar46) {
          iVar24 = 0;
LAB_00149273:
          lVar42 = (long)iVar24;
          pVVar17 = ppVVar27[lVar42];
          uVar16 = (ulong)pVVar17->bin_id;
          sVar33 = *(short *)((long)&local_138.cur_pos + uVar16 * 4);
          lVar22 = lVar42;
          lVar31 = lVar42;
          iVar49 = iVar24;
          if (sVar33 != -1) {
LAB_0014929c:
            if (low_effort != 0) {
              pVVar5 = ppVVar27[sVar33];
              lVar22 = 0;
              iVar49 = (1 << ((byte)pVVar5->palette_code_bits & 0x1f)) + 0x118;
              puVar35 = pVVar17->literal;
              puVar19 = pVVar5->literal;
              if (pVVar5->palette_code_bits < 1) {
                iVar49 = 0x118;
              }
              while( true ) {
                if (pVVar17->is_used[lVar22] != '\0') {
                  if (pVVar5->is_used[lVar22] == '\0') {
                    memcpy(puVar19,puVar35,(long)iVar49 << 2);
                  }
                  else {
                    (*VP8LAddVectorEq)(puVar35,puVar19,iVar49);
                  }
                }
                lVar22 = lVar22 + 1;
                if (lVar22 == 5) break;
                iVar49 = 0x100;
                puVar35 = pVVar17->red;
                puVar19 = pVVar5->red;
              }
              lVar22 = 0;
              do {
                uVar29 = pVVar17->trivial_symbol[lVar22];
                if (uVar29 != pVVar5->trivial_symbol[lVar22]) {
                  uVar29 = 0xffff;
                }
                pVVar5->trivial_symbol[lVar22] = uVar29;
                bVar55 = true;
                if (pVVar17->is_used[lVar22] == '\0') {
                  bVar55 = pVVar5->is_used[lVar22] != '\0';
                }
                pVVar5->is_used[lVar22] = bVar55;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 5);
              iVar49 = image_histo->size;
              image_histo->histograms[lVar42] = image_histo->histograms[(long)iVar49 + -1];
              uVar46 = iVar49 - 1;
              uVar48 = (ulong)uVar46;
              image_histo->size = uVar46;
              goto LAB_00149882;
            }
            lVar43 = pVVar17->bit_cost * local_1b0;
            lVar22 = lVar43 + 0x32;
            if (lVar43 < 0) {
              lVar22 = lVar43 + -0x32;
            }
            lVar43 = SUB168(SEXT816(lVar22) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar22;
            lVar47 = (long)sVar33;
            pVVar5 = ppVVar27[lVar47];
            lVar38 = pVVar17->bit_cost + pVVar5->bit_cost;
            lVar26 = (lVar43 >> 6) - (lVar43 >> 0x3f);
            lVar45 = lVar26 + lVar38;
            lVar43 = lVar45;
            if (0x7fffffffffffffff - lVar26 < lVar38) {
              lVar43 = 0x7fffffffffffffff;
            }
            if (lVar22 < 100) {
              lVar45 = lVar43;
            }
            iVar52 = GetCombinedHistogramEntropy
                               (pVVar5,pVVar17,lVar45,&local_140,(uint64_t *)&local_1a8);
            if (iVar52 == 0) {
              lVar22 = lVar31 + 1;
              uVar48 = (ulong)image_histo->size;
              if (lVar22 < (long)uVar48) goto code_r0x00149363;
              goto LAB_001498b7;
            }
            local_178 = pVVar17->alpha;
            local_148 = local_200->alpha;
            local_150 = pVVar5->blue;
            local_158 = pVVar17->blue;
            local_160 = local_200->blue;
            lVar22 = 0;
            iVar24 = (1 << ((byte)local_200->palette_code_bits & 0x1f)) + 0x118;
            puVar35 = pVVar5->literal;
            puVar19 = pVVar17->literal;
            puVar34 = local_200->literal;
            local_168 = lVar47;
            if (local_200->palette_code_bits < 1) {
              iVar24 = 0x118;
            }
            goto code_r0x00149619;
          }
LAB_0014938f:
          *(short *)((long)&local_138.cur_pos + uVar16 * 4) = (short)lVar22;
          iVar24 = (int)lVar22 + 1;
          goto LAB_00149882;
        }
        goto LAB_0014a608;
      }
    }
    goto LAB_001498b7;
  }
LAB_0014a390:
  WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
LAB_0014a59d:
  WebPSafeFree(local_170);
  return (int)(pic->error_code == VP8_ENC_OK);
code_r0x00149363:
  pVVar17 = ppVVar27[lVar31 + 1];
  uVar16 = (ulong)pVVar17->bin_id;
  sVar33 = *(short *)((long)&local_138.cur_pos + uVar16 * 4);
  lVar31 = lVar22;
  iVar49 = iVar49 + 1;
  if (sVar33 == -1) goto LAB_0014938f;
  goto LAB_0014929c;
code_r0x00149619:
  if (pVVar17 == local_200) {
    if (pVVar5->is_used[lVar22] != '\0') {
      if (local_200->is_used[lVar22] == '\0') goto LAB_0014968b;
      (*VP8LAddVectorEq)(puVar35,puVar34,iVar24);
    }
  }
  else if (pVVar5->is_used[lVar22] == '\0') {
    __n = (long)iVar24 << 2;
    if (pVVar17->is_used[lVar22] != '\0') goto LAB_00149698;
    memset(puVar34,0,__n);
  }
  else if (pVVar17->is_used[lVar22] == '\0') {
LAB_0014968b:
    __n = (long)iVar24 << 2;
    puVar19 = puVar35;
LAB_00149698:
    memcpy(puVar34,puVar19,__n);
  }
  else {
    (*VP8LAddVector)(puVar35,puVar19,puVar34,iVar24);
  }
  lVar22 = lVar22 + 1;
  if (lVar22 == 5) goto LAB_00149719;
  iVar24 = 0x100;
  puVar35 = pVVar5->red;
  puVar19 = pVVar17->red;
  puVar34 = local_200->red;
  goto code_r0x00149619;
LAB_00149719:
  lVar22 = 0;
  do {
    uVar29 = pVVar5->trivial_symbol[lVar22];
    if (uVar29 != pVVar17->trivial_symbol[lVar22]) {
      uVar29 = 0xffff;
    }
    local_200->trivial_symbol[lVar22] = uVar29;
    bVar55 = true;
    if (pVVar5->is_used[lVar22] == '\0') {
      bVar55 = pVVar17->is_used[lVar22] != '\0';
    }
    local_200->is_used[lVar22] = bVar55;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 5);
  local_200->bit_cost = local_140;
  local_200->costs[0] = (uint64_t)local_1a8.queue;
  local_200->costs[1] = local_1a8._8_8_;
  local_200->costs[2] = uStack_198;
  local_200->costs[3] = uStack_190;
  local_200->costs[4] = uStack_188;
  if (((local_200->trivial_symbol[1] == 0xffff) || (local_200->trivial_symbol[2] == 0xffff)) ||
     (local_200->trivial_symbol[3] == 0xffff)) {
    pVVar17 = ppVVar27[lVar31];
    bVar54 = true;
    bVar55 = true;
    if ((pVVar17->trivial_symbol[1] != 0xffff) && (pVVar17->trivial_symbol[2] != 0xffff)) {
      bVar55 = pVVar17->trivial_symbol[3] == 0xffff;
    }
    pVVar17 = ppVVar27[local_168];
    if ((pVVar17->trivial_symbol[1] != 0xffff) && (pVVar17->trivial_symbol[2] != 0xffff)) {
      bVar54 = pVVar17->trivial_symbol[3] == 0xffff;
    }
    if ((!(bool)(bVar54 & bVar55)) &&
       (uVar3 = *(ushort *)((long)&local_138.cur_pos + uVar16 * 4 + 2), uVar3 < 0x20)) {
      *(ushort *)((long)&local_138.cur_pos + uVar16 * 4 + 2) = uVar3 + 1;
      iVar24 = iVar49 + 1;
      uVar48 = (ulong)(uint)image_histo->size;
      goto LAB_00149882;
    }
  }
  else {
    pVVar17 = ppVVar27[local_168];
  }
  ppVVar27[local_168] = local_200;
  iVar24 = image_histo->size;
  image_histo->histograms[lVar31] = image_histo->histograms[(long)iVar24 + -1];
  uVar46 = iVar24 - 1;
  uVar48 = (ulong)uVar46;
  image_histo->size = uVar46;
  iVar24 = iVar49;
  local_200 = pVVar17;
LAB_00149882:
  if ((int)uVar48 <= iVar24) goto LAB_0014a5c9;
  goto LAB_00149273;
LAB_0014a5c9:
  if ((low_effort != 0) && (0 < (int)uVar48)) {
    lVar22 = 0;
    do {
      ComputeHistogramCost(ppVVar27[lVar22]);
      lVar22 = lVar22 + 1;
      uVar48 = (ulong)image_histo->size;
    } while (lVar22 < (long)uVar48);
  }
LAB_0014a608:
  if (low_effort != 0) {
LAB_0014a288:
    ppVVar27 = local_170->histograms;
    ppVVar4 = image_histo->histograms;
    uVar46 = image_histo->max_size;
    uVar16 = (ulong)uVar46;
    iVar24 = (int)uVar48;
    if (iVar24 < 2) {
      if ((int)uVar46 < 1) goto LAB_0014a570;
      memset(histogram_symbols,0,uVar16 * 4);
LAB_0014a3c2:
      VP8LHistogramSetClear(image_histo);
      image_histo->size = iVar24;
      uVar48 = 0;
      do {
        pVVar17 = ppVVar27[uVar48];
        if (pVVar17 != (VP8LHistogram *)0x0) {
          pVVar5 = ppVVar4[(int)histogram_symbols[uVar48]];
          lVar22 = 0;
          iVar24 = (1 << ((byte)pVVar5->palette_code_bits & 0x1f)) + 0x118;
          puVar35 = pVVar17->literal;
          puVar19 = pVVar5->literal;
          if (pVVar5->palette_code_bits < 1) {
            iVar24 = 0x118;
          }
          while( true ) {
            if (pVVar17->is_used[lVar22] != '\0') {
              if (pVVar5->is_used[lVar22] == '\0') {
                memcpy(puVar19,puVar35,(long)iVar24 << 2);
              }
              else {
                (*VP8LAddVectorEq)(puVar35,puVar19,iVar24);
              }
            }
            lVar22 = lVar22 + 1;
            if (lVar22 == 5) break;
            iVar24 = 0x100;
            puVar35 = pVVar17->red;
            puVar19 = pVVar5->red;
          }
          lVar22 = 0;
          do {
            uVar29 = pVVar17->trivial_symbol[lVar22];
            if (uVar29 != pVVar5->trivial_symbol[lVar22]) {
              uVar29 = 0xffff;
            }
            pVVar5->trivial_symbol[lVar22] = uVar29;
            bVar55 = true;
            if (pVVar17->is_used[lVar22] == '\0') {
              bVar55 = pVVar5->is_used[lVar22] != '\0';
            }
            pVVar5->is_used[lVar22] = bVar55;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 5);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar16);
    }
    else {
      if (0 < (int)uVar46) {
        uVar44 = 0;
        do {
          if (ppVVar27[uVar44] == (VP8LHistogram *)0x0) {
            histogram_symbols[uVar44] = histogram_symbols[uVar44 - 1];
          }
          else {
            uVar51 = 0;
            lVar22 = 0x7fffffffffffffff;
            uVar25 = 0;
            do {
              pVVar17 = ppVVar4[uVar51];
              lVar31 = pVVar17->bit_cost + lVar22;
              lVar42 = lVar31;
              if (0x7fffffffffffffff - lVar22 < (long)pVVar17->bit_cost) {
                lVar42 = 0x7fffffffffffffff;
              }
              if (lVar22 < 0) {
                lVar42 = lVar31;
              }
              iVar49 = GetCombinedHistogramEntropy
                                 (pVVar17,ppVVar27[uVar44],lVar42,(uint64_t *)&local_1a8,
                                  (uint64_t *)&local_138);
              if (iVar49 != 0) {
                lVar22 = (long)local_1a8.queue - pVVar17->bit_cost;
                uVar25 = uVar51 & 0xffffffff;
              }
              uVar51 = uVar51 + 1;
            } while ((uVar48 & 0xffffffff) != uVar51);
            histogram_symbols[uVar44] = (uint32_t)uVar25;
          }
          uVar44 = uVar44 + 1;
        } while (uVar44 != uVar16);
        goto LAB_0014a3c2;
      }
LAB_0014a570:
      VP8LHistogramSetClear(image_histo);
      image_histo->size = iVar24;
    }
    WebPReportProgress(pic,percent_range + *percent,percent);
    goto LAB_0014a59d;
  }
LAB_001498b7:
  uVar46 = (uint)uVar48;
  iVar24 = quality * quality * quality;
  lVar31 = (long)(iVar24 * 99);
  lVar22 = lVar31 + -500000;
  if (-1 < iVar24) {
    lVar22 = lVar31 + 500000;
  }
  iVar24 = (int)(SUB168(SEXT816(lVar22) * SEXT816(0x431bde82d7b634db),8) >> 0x12);
  iVar49 = SUB164(SEXT816(lVar22) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f;
  iVar52 = iVar24 - iVar49;
  ppVVar27 = image_histo->histograms;
  local_148 = (uint32_t *)CONCAT44(local_148._4_4_,iVar52);
  if (iVar52 < (int)uVar46) {
    local_1a8.size = 0;
    local_1a8.max_size = 9;
    local_1a8.queue = (HistogramPair *)WebPSafeMalloc(10,0x40);
    if (local_1a8.queue != (HistogramPair *)0x0) {
      local_168 = CONCAT44(local_168._4_4_,(iVar24 - iVar49) + 1);
      if (0 < (int)uVar46) {
        local_1f0 = 1;
        puVar35 = (uint32_t *)0x0;
        iVar24 = 0;
        uVar50 = 0;
        iVar49 = 0;
        do {
          iVar52 = image_histo->size;
          if ((iVar52 <= (int)local_148) ||
             (iVar49 = iVar49 + 1, (int)(((uint)(uVar48 >> 0x1f) & 1) + uVar46) >> 1 <= iVar49))
          break;
          local_178 = (uint32_t *)CONCAT44(local_178._4_4_,uVar50);
          if (iVar24 == 0) {
            iVar32 = 0;
          }
          else {
            iVar32 = (local_1a8.queue)->cost_diff;
          }
          if (1 < iVar52) {
            uVar50 = (iVar52 + -1) * iVar52;
            iVar53 = iVar52 / 2;
            iVar14 = 1;
            while( true ) {
              uVar15 = (uint)((local_1f0 * 0xbc8f) / 0x7fffffff);
              local_1f0 = (ulong)((int)(local_1f0 * 0xbc8f) + (uVar15 << 0x1f | uVar15));
              uVar16 = local_1f0 % (ulong)uVar50;
              uVar30 = (uint)(uVar16 % (ulong)(iVar52 - 1));
              uVar15 = (uint)(uVar16 / (iVar52 - 1));
              iVar18 = HistoQueuePush(&local_1a8,ppVVar27,uVar15,
                                      (uVar30 + 1) - (uint)(uVar30 < uVar15),iVar32);
              puVar35 = (uint32_t *)(local_1a8._8_8_ & 0xffffffff);
              iVar24 = local_1a8.size;
              if ((iVar18 < 0) && (local_1a8.size == local_1a8.max_size)) break;
              if (iVar18 < 0) {
                iVar32 = iVar18;
              }
              iVar52 = image_histo->size;
              if ((iVar52 < 2) || (bVar55 = iVar53 <= iVar14, iVar14 = iVar14 + 1, bVar55)) break;
            }
          }
          pHVar12 = local_1a8.queue;
          if (iVar24 == 0) {
            iVar24 = 0;
          }
          else {
            iVar24 = (local_1a8.queue)->idx1;
            iVar49 = (local_1a8.queue)->idx2;
            local_158 = (uint32_t *)(long)iVar49;
            pVVar17 = ppVVar27[(long)local_158];
            local_160 = (uint32_t *)(long)iVar24;
            pVVar5 = ppVVar27[(long)local_160];
            lVar22 = 0;
            iVar52 = (1 << ((byte)pVVar5->palette_code_bits & 0x1f)) + 0x118;
            puVar19 = pVVar17->literal;
            puVar34 = pVVar5->literal;
            local_150 = puVar35;
            if (pVVar5->palette_code_bits < 1) {
              iVar52 = 0x118;
            }
            while( true ) {
              if (pVVar17->is_used[lVar22] != '\0') {
                if (pVVar5->is_used[lVar22] == '\0') {
                  memcpy(puVar34,puVar19,(long)iVar52 << 2);
                }
                else {
                  (*VP8LAddVectorEq)(puVar19,puVar34,iVar52);
                }
              }
              lVar22 = lVar22 + 1;
              if (lVar22 == 5) break;
              iVar52 = 0x100;
              puVar19 = pVVar17->red;
              puVar34 = pVVar5->red;
            }
            lVar22 = 0;
            do {
              uVar29 = pVVar17->trivial_symbol[lVar22];
              if (uVar29 != pVVar5->trivial_symbol[lVar22]) {
                uVar29 = 0xffff;
              }
              pVVar5->trivial_symbol[lVar22] = uVar29;
              bVar55 = true;
              if (pVVar17->is_used[lVar22] == '\0') {
                bVar55 = pVVar5->is_used[lVar22] != '\0';
              }
              pVVar5->is_used[lVar22] = bVar55;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 5);
            pVVar17 = ppVVar27[(long)local_160];
            pVVar17->bit_cost = pHVar12->cost_combo;
            lVar22 = 0;
            do {
              pVVar17->costs[lVar22] = pHVar12->costs[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 5);
            iVar52 = image_histo->size;
            image_histo->histograms[(long)local_158] = image_histo->histograms[(long)iVar52 + -1];
            image_histo->size = iVar52 + -1;
            puVar35 = local_150;
            if (0 < (int)local_150) {
              iVar52 = 0;
              do {
                pHVar1 = pHVar12 + iVar52;
                iVar14 = pHVar12[iVar52].idx1;
                iVar53 = pHVar12[iVar52].idx2;
                iVar21 = (int)puVar35;
                if ((iVar14 != iVar49 && iVar14 != iVar24) || (iVar53 != iVar49 && iVar53 != iVar24)
                   ) {
                  if ((iVar14 == iVar49 || iVar14 == iVar24) ||
                      (iVar53 == iVar49 || iVar53 == iVar24)) {
                    if (iVar14 == iVar49) {
                      pHVar1->idx1 = iVar24;
                      iVar14 = iVar24;
                    }
                    if (iVar53 == iVar49) {
                      pHVar1->idx2 = iVar24;
                      iVar53 = iVar24;
                    }
                    iVar20 = iVar14;
                    if (iVar53 < iVar14) {
                      pHVar1->idx1 = iVar53;
                      pHVar1->idx2 = iVar14;
                      iVar20 = iVar53;
                      iVar53 = iVar14;
                    }
                    iVar14 = HistoQueueUpdatePair(ppVVar27[iVar20],ppVVar27[iVar53],0,pHVar1);
                    if (iVar14 == 0) {
                      puVar35 = (uint32_t *)(long)iVar21;
                      goto LAB_00149cc9;
                    }
                    iVar14 = pHVar1->idx1;
                  }
                  iVar53 = image_histo->size;
                  if (iVar14 == iVar53) {
                    pHVar1->idx1 = iVar49;
                    iVar14 = iVar49;
                  }
                  iVar21 = pHVar1->idx2;
                  if (pHVar1->idx2 == iVar53) {
                    pHVar1->idx2 = iVar49;
                    iVar21 = iVar49;
                  }
                  if (iVar21 < iVar14) {
                    pHVar1->idx1 = iVar21;
                    pHVar1->idx2 = iVar14;
                  }
                  if (pHVar1->cost_diff < pHVar12->cost_diff) {
                    local_138.cur_pos = *(PixOrCopy **)pHVar12;
                    local_138.cur_block = (PixOrCopyBlock *)pHVar12->cost_diff;
                    local_138.last_pos = (PixOrCopy *)pHVar12->cost_combo;
                    uStack_120 = pHVar12->costs[0];
                    uStack_118 = pHVar12->costs[1];
                    uStack_110 = pHVar12->costs[2];
                    uStack_108 = pHVar12->costs[3];
                    uStack_100 = pHVar12->costs[4];
                    iVar14 = pHVar1->idx1;
                    iVar53 = pHVar1->idx2;
                    iVar32 = pHVar1->cost_diff;
                    uVar7 = pHVar1->cost_combo;
                    uVar8 = pHVar1->costs[0];
                    uVar9 = pHVar1->costs[1];
                    uVar10 = pHVar1->costs[2];
                    uVar11 = pHVar1->costs[4];
                    pHVar12->costs[3] = pHVar1->costs[3];
                    pHVar12->costs[4] = uVar11;
                    pHVar12->costs[1] = uVar9;
                    pHVar12->costs[2] = uVar10;
                    pHVar12->cost_combo = uVar7;
                    pHVar12->costs[0] = uVar8;
                    pHVar12->idx1 = iVar14;
                    pHVar12->idx2 = iVar53;
                    pHVar12->cost_diff = iVar32;
                    pHVar1->costs[3] = uStack_108;
                    pHVar1->costs[4] = uStack_100;
                    pHVar1->costs[1] = uStack_118;
                    pHVar1->costs[2] = uStack_110;
                    pHVar1->cost_combo = (uint64_t)local_138.last_pos;
                    pHVar1->costs[0] = uStack_120;
                    *(PixOrCopy **)pHVar1 = local_138.cur_pos;
                    pHVar1->cost_diff = (int64_t)local_138.cur_block;
                  }
                  iVar52 = iVar52 + 1;
                }
                else {
LAB_00149cc9:
                  pHVar2 = pHVar12 + (long)iVar21 + -1;
                  iVar14 = pHVar2->idx1;
                  iVar53 = pHVar2->idx2;
                  iVar32 = pHVar2->cost_diff;
                  uVar9 = pHVar12[(long)iVar21 + -1].cost_combo;
                  uVar10 = (&pHVar12[(long)iVar21 + -1].cost_combo)[1];
                  uVar7 = pHVar12[(long)iVar21 + -1].costs[1];
                  uVar8 = (pHVar12[(long)iVar21 + -1].costs + 1)[1];
                  uVar11 = (pHVar12[(long)iVar21 + -1].costs + 3)[1];
                  pHVar1->costs[3] = pHVar12[(long)iVar21 + -1].costs[3];
                  pHVar1->costs[4] = uVar11;
                  pHVar1->costs[1] = uVar7;
                  pHVar1->costs[2] = uVar8;
                  pHVar1->cost_combo = uVar9;
                  pHVar1->costs[0] = uVar10;
                  pHVar1->idx1 = iVar14;
                  pHVar1->idx2 = iVar53;
                  pHVar1->cost_diff = iVar32;
                  puVar35 = (uint32_t *)(ulong)((int)puVar35 - 1);
                }
              } while (iVar52 < (int)puVar35);
            }
            iVar24 = (int)puVar35;
            local_1a8.size = iVar24;
            iVar49 = 0;
          }
          uVar50 = (int)local_178 + 1;
        } while (uVar50 != uVar46);
      }
      iVar24 = image_histo->size;
      WebPSafeFree(local_1a8.queue);
      uVar46 = image_histo->size;
      uVar48 = (ulong)uVar46;
      if ((int)local_168 < iVar24) goto LAB_0014a288;
      ppVVar27 = image_histo->histograms;
      goto LAB_00149e91;
    }
  }
  else {
LAB_00149e91:
    local_1a8._8_8_ = (ulong)(uVar46 * uVar46) << 0x20;
    local_1a8.queue = (HistogramPair *)WebPSafeMalloc((ulong)(uVar46 * uVar46 + 1),0x40);
    if (local_1a8.queue != (HistogramPair *)0x0) {
      if (0 < (int)uVar46) {
        uVar50 = 0;
        do {
          uVar15 = uVar50 + 1;
          uVar30 = uVar15;
          if ((int)uVar15 < (int)uVar46) {
            do {
              HistoQueuePush(&local_1a8,ppVVar27,uVar50,uVar30,0);
              uVar30 = uVar30 + 1;
            } while (uVar46 != uVar30);
          }
          uVar50 = uVar15;
        } while (uVar15 != uVar46);
        iVar24 = local_1a8.size;
        pHVar12 = local_1a8.queue;
        while (local_1a8.queue = pHVar12, 0 < iVar24) {
          iVar49 = pHVar12->idx1;
          iVar52 = pHVar12->idx2;
          pVVar17 = ppVVar27[iVar52];
          pVVar5 = ppVVar27[iVar49];
          lVar22 = 0;
          iVar14 = (1 << ((byte)pVVar5->palette_code_bits & 0x1f)) + 0x118;
          puVar35 = pVVar17->literal;
          puVar19 = pVVar5->literal;
          if (pVVar5->palette_code_bits < 1) {
            iVar14 = 0x118;
          }
          while( true ) {
            if (pVVar17->is_used[lVar22] != '\0') {
              if (pVVar5->is_used[lVar22] == '\0') {
                memcpy(puVar19,puVar35,(long)iVar14 << 2);
              }
              else {
                (*VP8LAddVectorEq)(puVar35,puVar19,iVar14);
              }
            }
            lVar22 = lVar22 + 1;
            if (lVar22 == 5) break;
            iVar14 = 0x100;
            puVar35 = pVVar17->red;
            puVar19 = pVVar5->red;
          }
          lVar22 = 0;
          do {
            uVar29 = pVVar17->trivial_symbol[lVar22];
            if (uVar29 != pVVar5->trivial_symbol[lVar22]) {
              uVar29 = 0xffff;
            }
            pVVar5->trivial_symbol[lVar22] = uVar29;
            bVar55 = true;
            if (pVVar17->is_used[lVar22] == '\0') {
              bVar55 = pVVar5->is_used[lVar22] != '\0';
            }
            pVVar5->is_used[lVar22] = bVar55;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 5);
          pVVar17 = ppVVar27[iVar49];
          pVVar17->bit_cost = pHVar12->cost_combo;
          lVar22 = 0;
          do {
            pVVar17->costs[lVar22] = pHVar12->costs[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 5);
          iVar14 = image_histo->size;
          image_histo->histograms[iVar52] = image_histo->histograms[(long)iVar14 + -1];
          image_histo->size = iVar14 + -1;
          iVar14 = 0;
          do {
            pHVar1 = pHVar12 + iVar14;
            iVar53 = pHVar12[iVar14].idx1;
            if ((((iVar53 == iVar49) || (iVar21 = pHVar1->idx2, iVar21 == iVar52)) ||
                (iVar53 == iVar52)) || (iVar21 == iVar49)) {
              pHVar2 = pHVar12 + (long)iVar24 + -1;
              iVar53 = pHVar2->idx1;
              iVar21 = pHVar2->idx2;
              iVar32 = pHVar2->cost_diff;
              uVar9 = pHVar12[(long)iVar24 + -1].cost_combo;
              uVar10 = (&pHVar12[(long)iVar24 + -1].cost_combo)[1];
              uVar7 = pHVar12[(long)iVar24 + -1].costs[1];
              uVar8 = (pHVar12[(long)iVar24 + -1].costs + 1)[1];
              uVar11 = (pHVar12[(long)iVar24 + -1].costs + 3)[1];
              pHVar1->costs[3] = pHVar12[(long)iVar24 + -1].costs[3];
              pHVar1->costs[4] = uVar11;
              pHVar1->costs[1] = uVar7;
              pHVar1->costs[2] = uVar8;
              pHVar1->cost_combo = uVar9;
              pHVar1->costs[0] = uVar10;
              pHVar1->idx1 = iVar53;
              pHVar1->idx2 = iVar21;
              pHVar1->cost_diff = iVar32;
              iVar24 = iVar24 + -1;
            }
            else {
              iVar20 = image_histo->size;
              if (iVar53 == iVar20) {
                pHVar1->idx1 = iVar52;
                iVar53 = iVar52;
              }
              if (iVar21 == iVar20) {
                pHVar1->idx2 = iVar52;
                iVar21 = iVar52;
              }
              if (iVar21 < iVar53) {
                pHVar1->idx1 = iVar21;
                pHVar1->idx2 = iVar53;
              }
              if (pHVar1->cost_diff < pHVar12->cost_diff) {
                local_138.cur_pos = *(PixOrCopy **)pHVar12;
                local_138.cur_block = (PixOrCopyBlock *)pHVar12->cost_diff;
                local_138.last_pos = (PixOrCopy *)pHVar12->cost_combo;
                uStack_120 = pHVar12->costs[0];
                uStack_118 = pHVar12->costs[1];
                uStack_110 = pHVar12->costs[2];
                uStack_108 = pHVar12->costs[3];
                uStack_100 = pHVar12->costs[4];
                iVar53 = pHVar1->idx1;
                iVar21 = pHVar1->idx2;
                iVar32 = pHVar1->cost_diff;
                uVar7 = pHVar1->cost_combo;
                uVar8 = pHVar1->costs[0];
                uVar9 = pHVar1->costs[1];
                uVar10 = pHVar1->costs[2];
                uVar11 = pHVar1->costs[4];
                pHVar12->costs[3] = pHVar1->costs[3];
                pHVar12->costs[4] = uVar11;
                pHVar12->costs[1] = uVar9;
                pHVar12->costs[2] = uVar10;
                pHVar12->cost_combo = uVar7;
                pHVar12->costs[0] = uVar8;
                pHVar12->idx1 = iVar53;
                pHVar12->idx2 = iVar21;
                pHVar12->cost_diff = iVar32;
                pHVar1->costs[3] = uStack_108;
                pHVar1->costs[4] = uStack_100;
                pHVar1->costs[1] = uStack_118;
                pHVar1->costs[2] = uStack_110;
                pHVar1->cost_combo = (uint64_t)local_138.last_pos;
                pHVar1->costs[0] = uStack_120;
                *(PixOrCopy **)pHVar1 = local_138.cur_pos;
                pHVar1->cost_diff = (int64_t)local_138.cur_block;
              }
              iVar14 = iVar14 + 1;
            }
          } while (iVar14 < iVar24);
          iVar52 = image_histo->size;
          local_1a8.size = iVar24;
          pHVar12 = local_1a8.queue;
          if (0 < iVar52) {
            iVar24 = 0;
            do {
              if (iVar49 != iVar24) {
                HistoQueuePush(&local_1a8,image_histo->histograms,iVar49,iVar24,0);
                iVar52 = image_histo->size;
              }
              iVar24 = iVar24 + 1;
            } while (iVar24 < iVar52);
            iVar24 = local_1a8.size;
            pHVar12 = local_1a8.queue;
          }
        }
      }
      WebPSafeFree(local_1a8.queue);
      uVar48 = (ulong)(uint)image_histo->size;
      goto LAB_0014a288;
    }
  }
  WebPSafeFree((void *)0x0);
  goto LAB_0014a390;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  if (orig_histo == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  HistogramCopyAndAnalyze(orig_histo, image_histo);
  entropy_combine =
      (image_histo->size > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);

    HistogramAnalyzeEntropyBin(image_histo, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, tmp_histo, entropy_combine_num_bins,
                               combine_cost_factor, low_effort);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, threshold_size, &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      if (!HistogramCombineGreedy(image_histo)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  return (pic->error_code == VP8_ENC_OK);
}